

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::getCode(int po,int rlc,longlong *c,int *lc,char **in,char *in_end,unsigned_short **out
                     ,unsigned_short *ob,unsigned_short *oe)

{
  unsigned_short uVar1;
  long lVar2;
  byte *pbVar3;
  unsigned_short *puVar4;
  unsigned_short s;
  uchar cs;
  char *in_end_local;
  char **in_local;
  int *lc_local;
  longlong *c_local;
  int rlc_local;
  int po_local;
  
  if (po == rlc) {
    if (*lc < 8) {
      if (in_end <= *in) {
        return false;
      }
      lVar2 = *c;
      pbVar3 = (byte *)*in;
      *in = (char *)(pbVar3 + 1);
      *c = lVar2 << 8 | (ulong)*pbVar3;
      *lc = *lc + 8;
    }
    *lc = *lc + -8;
    cs = (uchar)(*c >> ((byte)*lc & 0x3f));
    if (oe < *out + (int)(uint)cs) {
      return false;
    }
    if (*out + -1 < ob) {
      return false;
    }
    uVar1 = (*out)[-1];
    while (cs != '\0') {
      puVar4 = *out;
      *out = puVar4 + 1;
      *puVar4 = uVar1;
      cs = cs + 0xff;
    }
  }
  else {
    if (oe <= *out) {
      return false;
    }
    puVar4 = *out;
    *out = puVar4 + 1;
    *puVar4 = (unsigned_short)po;
  }
  return true;
}

Assistant:

static bool getCode(int po, int rlc, long long &c, int &lc, const char *&in,
                    const char *in_end, unsigned short *&out,
                    const unsigned short *ob, const unsigned short *oe) {
  (void)ob;
  if (po == rlc) {
    if (lc < 8) {
      /* TinyEXR issue 78 */
      /* TinyEXR issue 160. in + 1 -> in */
      if (in >= in_end) {
        return false;
      }

      getChar(c, lc, in);
    }

    lc -= 8;

    unsigned char cs = (c >> lc);

    if (out + cs > oe) return false;

    // Bounds check for safety
    // Issue 100.
    if ((out - 1) < ob) return false;
    unsigned short s = out[-1];

    while (cs-- > 0) *out++ = s;
  } else if (out < oe) {
    *out++ = po;
  } else {
    return false;
  }
  return true;
}